

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp64.hh
# Opt level: O1

void __thiscall
helix::nasdaq::moldudp64_session<helix::parity::pmd_handler>::retransmit_request
          (moldudp64_session<helix::parity::pmd_handler> *this,uint64_t seq_no,
          uint64_t expected_seq_no)

{
  runtime_error *this_00;
  long *plVar1;
  size_type *psVar2;
  moldudp64_request_packet request_packet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  if ((this->_send_cb).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_88._10_8_ =
         expected_seq_no >> 0x38 | (expected_seq_no & 0xff000000000000) >> 0x28 |
         (expected_seq_no & 0xff0000000000) >> 0x18 | (expected_seq_no & 0xff00000000) >> 8 |
         (expected_seq_no & 0xff000000) << 8 | (expected_seq_no & 0xff0000) << 0x18 |
         (expected_seq_no & 0xff00) << 0x28 | expected_seq_no << 0x38;
    local_e8._M_dataplus._M_p = (pointer)&local_88;
    local_88.field_2._M_allocated_capacity._2_2_ = 0xfeff;
    local_a8._M_dataplus._M_p = (pointer)0x14;
    (*(this->_send_cb)._M_invoker)
              ((_Any_data *)&this->_send_cb,(char **)&local_e8,(unsigned_long *)&local_a8);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"invalid sequence number: ","");
  std::__cxx11::to_string(&local_48,seq_no);
  std::operator+(&local_a8,&local_c8,&local_48);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_a8);
  local_e8._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_e8._M_dataplus._M_p == psVar2) {
    local_e8.field_2._M_allocated_capacity = *psVar2;
    local_e8.field_2._8_8_ = plVar1[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar2;
  }
  local_e8._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_68,expected_seq_no);
  std::operator+(&local_88,&local_e8,&local_68);
  std::runtime_error::runtime_error(this_00,(string *)&local_88);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void moldudp64_session<Handler>::retransmit_request(uint64_t seq_no, uint64_t expected_seq_no)
{
    if (!bool(_send_cb)) {
         throw std::runtime_error(std::string("invalid sequence number: ") + std::to_string(seq_no) + ", expected: " + std::to_string(expected_seq_no));
    }
    uint64_t message_count = 0xfffe;

    moldudp64_request_packet request_packet;
    request_packet.SequenceNumber = htobe64(expected_seq_no);
    request_packet.MessageCount = htobe16(message_count);

    char *base = reinterpret_cast<char*>(&request_packet);
    size_t len = sizeof(request_packet);

    _send_cb(base, len);
}